

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O0

golf_bvh_node_info_t *
golf_bvh_node_info(golf_bvh_node_info_t *__return_storage_ptr__,golf_bvh_t *bvh,int idx,
                  golf_level_t *level,golf_entity_t *entity,float t)

{
  golf_transform_t transform_00;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  mat4 m_02;
  golf_transform_t transform_01;
  golf_movement_t movement_00;
  _Bool _Var1;
  int iVar2;
  golf_movement_t *__src;
  golf_bvh_aabb_t *aabb;
  vec3 vVar3;
  vec3 vVar4;
  vec3 vVar5;
  vec3 vVar6;
  undefined8 in_stack_fffffffffffff2c0;
  golf_bvh_node_info_t *info;
  float local_c40 [2];
  golf_bvh_face_t face;
  vec3 c;
  vec3 b;
  vec3 a;
  int local_a94;
  int v_idx;
  int j;
  undefined1 local_630 [8];
  golf_material_t material;
  golf_model_group_t group;
  int i;
  mat4 model_mat;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  golf_transform_t local_118;
  undefined8 uStack_f0;
  golf_transform_t moved_transform;
  golf_movement_t *movement;
  golf_transform_t transform;
  golf_model_t *model;
  float t_local;
  golf_entity_t *entity_local;
  golf_level_t *level_local;
  int idx_local;
  golf_bvh_t *bvh_local;
  
  transform.scale._4_8_ = golf_entity_get_model(entity);
  golf_entity_get_world_transform((golf_transform_t *)&movement,level,entity);
  __src = golf_entity_get_movement(entity);
  __return_storage_ptr__->idx = idx;
  __return_storage_ptr__->face_start = (bvh->faces).length;
  __return_storage_ptr__->face_count = *(int *)(transform.scale._4_8_ + 0x20) / 3;
  vVar3 = vec3_create(0.0,0.0,0.0);
  (__return_storage_ptr__->pos).z = vVar3.z;
  (__return_storage_ptr__->pos).x = (float)(int)vVar3._0_8_;
  (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
  vVar3 = vec3_create(3.4028235e+38,3.4028235e+38,3.4028235e+38);
  (__return_storage_ptr__->aabb).min.z = vVar3.z;
  (__return_storage_ptr__->aabb).min.x = (float)(int)vVar3._0_8_;
  (__return_storage_ptr__->aabb).min.y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
  vVar3 = vec3_create(1.1754944e-38,1.1754944e-38,1.1754944e-38);
  moved_transform.scale._4_8_ = vVar3._0_8_;
  (__return_storage_ptr__->aabb).max.x = moved_transform.scale.y;
  (__return_storage_ptr__->aabb).max.y = moved_transform.scale.z;
  (__return_storage_ptr__->aabb).max.z = vVar3.z;
  memcpy(&uStack_f0,&movement,0x28);
  if (__src != (golf_movement_t *)0x0) {
    memcpy(model_mat.m + 0xe,__src,0x28);
    transform_00.position.z = moved_transform.position.x;
    transform_00.rotation.x = moved_transform.position.y;
    transform_00.position.x = (float)(undefined4)uStack_f0;
    transform_00.position.y = (float)uStack_f0._4_4_;
    transform_00.rotation.y = moved_transform.position.z;
    transform_00.rotation.z = moved_transform.rotation.x;
    transform_00.rotation.w = moved_transform.rotation.y;
    transform_00.scale.x = moved_transform.rotation.z;
    transform_00.scale.y = moved_transform.rotation.w;
    transform_00.scale.z = moved_transform.scale.x;
    movement_00._8_8_ = uStack_138;
    movement_00._0_8_ = model_mat.m._56_8_;
    movement_00.field_4._0_8_ = local_130;
    movement_00.field_4._8_8_ = uStack_128;
    movement_00.field_4._16_8_ = local_120;
    golf_transform_apply_movement(&local_118,transform_00,movement_00,t);
    memcpy(&uStack_f0,&local_118,0x28);
    in_stack_fffffffffffff2c0 = model_mat.m._56_8_;
  }
  transform_01.position.z = moved_transform.position.z;
  transform_01.position.x = moved_transform.position.x;
  transform_01.position.y = moved_transform.position.y;
  transform_01.rotation.x = moved_transform.rotation.x;
  transform_01.rotation.y = moved_transform.rotation.y;
  transform_01.rotation.z = moved_transform.rotation.z;
  transform_01.rotation.w = moved_transform.rotation.w;
  transform_01.scale.x = moved_transform.scale.x;
  transform_01.scale.y = (float)in_stack_fffffffffffff2c0;
  transform_01.scale.z = SUB84(in_stack_fffffffffffff2c0,4);
  golf_transform_get_model_mat(transform_01);
  for (group.start_vertex = 0; group.start_vertex < *(int *)(transform.scale._4_8_ + 8);
      group.start_vertex = group.start_vertex + 1) {
    memcpy((void *)((long)&material.field_6 + 0x404),
           (void *)(*(long *)transform.scale._4_8_ + (long)group.start_vertex * 0x48),0x48);
    _Var1 = golf_level_get_material
                      (level,(char *)((long)&material.field_6 + 0x404),(golf_material_t *)local_630)
    ;
    if (!_Var1) {
      golf_material_texture((golf_material_t *)&v_idx,"",0.0,0.0,0.0,"data/textures/fallback.png");
      memcpy(local_630,&v_idx,0x460);
    }
    for (local_a94 = 0; local_a94 < (int)group.material_name._60_4_; local_a94 = local_a94 + 3) {
      iVar2 = group.material_name._56_4_ + local_a94;
      vVar4.z = *(float *)(*(long *)(transform.scale._4_8_ + 0x18) + 8 + (long)iVar2 * 0xc);
      vVar4._0_8_ = *(undefined8 *)(*(long *)(transform.scale._4_8_ + 0x18) + (long)iVar2 * 0xc);
      m.m[2] = model_mat.m[0];
      m.m[3] = model_mat.m[1];
      m.m._0_8_ = stack0xfffffffffffffe80;
      m.m[4] = model_mat.m[2];
      m.m[5] = model_mat.m[3];
      m.m[6] = model_mat.m[4];
      m.m[7] = model_mat.m[5];
      m.m[8] = model_mat.m[6];
      m.m[9] = model_mat.m[7];
      m.m[10] = model_mat.m[8];
      m.m[0xb] = model_mat.m[9];
      m.m[0xc] = model_mat.m[10];
      m.m[0xd] = model_mat.m[0xb];
      m.m[0xe] = model_mat.m[0xc];
      m.m[0xf] = model_mat.m[0xd];
      vVar4 = vec3_apply_mat4(vVar4,1.0,m);
      vVar5.z = *(float *)(*(long *)(transform.scale._4_8_ + 0x18) + 8 + (long)(iVar2 + 1) * 0xc);
      vVar5._0_8_ = *(undefined8 *)
                     (*(long *)(transform.scale._4_8_ + 0x18) + (long)(iVar2 + 1) * 0xc);
      m_00.m[2] = model_mat.m[0];
      m_00.m[3] = model_mat.m[1];
      m_00.m._0_8_ = stack0xfffffffffffffe80;
      m_00.m[4] = model_mat.m[2];
      m_00.m[5] = model_mat.m[3];
      m_00.m[6] = model_mat.m[4];
      m_00.m[7] = model_mat.m[5];
      m_00.m[8] = model_mat.m[6];
      m_00.m[9] = model_mat.m[7];
      m_00.m[10] = model_mat.m[8];
      m_00.m[0xb] = model_mat.m[9];
      m_00.m[0xc] = model_mat.m[10];
      m_00.m[0xd] = model_mat.m[0xb];
      m_00.m[0xe] = model_mat.m[0xc];
      m_00.m[0xf] = model_mat.m[0xd];
      vVar5 = vec3_apply_mat4(vVar5,1.0,m_00);
      vVar3.z = *(float *)(*(long *)(transform.scale._4_8_ + 0x18) + 8 + (long)(iVar2 + 2) * 0xc);
      vVar3._0_8_ = *(undefined8 *)
                     (*(long *)(transform.scale._4_8_ + 0x18) + (long)(iVar2 + 2) * 0xc);
      m_01.m[2] = model_mat.m[0];
      m_01.m[3] = model_mat.m[1];
      m_01.m._0_8_ = stack0xfffffffffffffe80;
      m_01.m[4] = model_mat.m[2];
      m_01.m[5] = model_mat.m[3];
      m_01.m[6] = model_mat.m[4];
      m_01.m[7] = model_mat.m[5];
      m_01.m[8] = model_mat.m[6];
      m_01.m[9] = model_mat.m[7];
      m_01.m[10] = model_mat.m[8];
      m_01.m[0xb] = model_mat.m[9];
      m_01.m[0xc] = model_mat.m[10];
      m_01.m[0xd] = model_mat.m[0xb];
      m_01.m[0xe] = model_mat.m[0xc];
      m_01.m[0xf] = model_mat.m[0xd];
      vVar3 = vec3_apply_mat4(vVar3,1.0,m_01);
      vVar6 = vec3_add(__return_storage_ptr__->pos,vVar4);
      (__return_storage_ptr__->pos).z = vVar6.z;
      (__return_storage_ptr__->pos).x = (float)(int)vVar6._0_8_;
      (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
      vVar6 = vec3_add(__return_storage_ptr__->pos,vVar5);
      (__return_storage_ptr__->pos).z = vVar6.z;
      (__return_storage_ptr__->pos).x = (float)(int)vVar6._0_8_;
      (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
      vVar6 = vec3_add(__return_storage_ptr__->pos,vVar3);
      face._80_8_ = vVar6._0_8_;
      (__return_storage_ptr__->pos).x = face.vel_scale;
      (__return_storage_ptr__->pos).y = (float)face._84_4_;
      (__return_storage_ptr__->pos).z = vVar6.z;
      face.water_dir.y = (float)material._64_4_;
      face.water_dir.z = (float)material.name._59_4_;
      face.restitution = material.friction;
      local_c40[0] = t;
      face._0_8_ = level;
      face.level = (golf_level_t *)entity;
      face.entity = vVar4._0_8_;
      face.a.x = vVar4.z;
      face.a._4_8_ = vVar5._0_8_;
      face.b.x = vVar5.z;
      face.b._4_8_ = vVar3._0_8_;
      face.c.x = vVar3.z;
      if ((*(byte *)(transform.scale._4_8_ + 0x60) & 1) == 0) {
        vVar6 = vec3_create(0.0,0.0,0.0);
        face.water_dir.x = vVar6.z;
        face.c._4_8_ = vVar6._0_8_;
      }
      else {
        vVar6.z = *(float *)(*(long *)(transform.scale._4_8_ + 0x68) + 8 +
                            (long)(local_a94 / 3) * 0xc);
        vVar6._0_8_ = *(undefined8 *)
                       (*(long *)(transform.scale._4_8_ + 0x68) + (long)(local_a94 / 3) * 0xc);
        m_02.m[2] = model_mat.m[0];
        m_02.m[3] = model_mat.m[1];
        m_02.m._0_8_ = stack0xfffffffffffffe80;
        m_02.m[4] = model_mat.m[2];
        m_02.m[5] = model_mat.m[3];
        m_02.m[6] = model_mat.m[4];
        m_02.m[7] = model_mat.m[5];
        m_02.m[8] = model_mat.m[6];
        m_02.m[9] = model_mat.m[7];
        m_02.m[10] = model_mat.m[8];
        m_02.m[0xb] = model_mat.m[9];
        m_02.m[0xc] = model_mat.m[10];
        m_02.m[0xd] = model_mat.m[0xb];
        m_02.m[0xe] = model_mat.m[0xc];
        m_02.m[0xf] = model_mat.m[0xd];
        vVar6 = vec3_apply_mat4(vVar6,0.0,m_02);
        face.water_dir.x = vVar6.z;
        face.c._4_8_ = vVar6._0_8_;
      }
      iVar2 = vec_expand_((char **)bvh,&(bvh->faces).length,&(bvh->faces).capacity,0x58,
                          (bvh->faces).alloc_category);
      if (iVar2 == 0) {
        iVar2 = (bvh->faces).length;
        (bvh->faces).length = iVar2 + 1;
        memcpy((bvh->faces).data + iVar2,local_c40,0x58);
      }
      aabb = &__return_storage_ptr__->aabb;
      _update_aabb(aabb,vVar4);
      _update_aabb(aabb,vVar5);
      _update_aabb(aabb,vVar3);
    }
  }
  vVar3 = vec3_scale(__return_storage_ptr__->pos,1.0 / (float)*(int *)(transform.scale._4_8_ + 0x20)
                    );
  (__return_storage_ptr__->pos).x = (float)(int)vVar3._0_8_;
  (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
  (__return_storage_ptr__->pos).z = vVar3.z;
  return __return_storage_ptr__;
}

Assistant:

golf_bvh_node_info_t golf_bvh_node_info(golf_bvh_t *bvh, int idx, golf_level_t *level, golf_entity_t *entity, float t) {
    golf_model_t *model = golf_entity_get_model(entity);
    golf_transform_t transform = golf_entity_get_world_transform(level, entity);
    golf_movement_t *movement = golf_entity_get_movement(entity);

    golf_bvh_node_info_t info;
    info.idx = idx;
    info.face_start = bvh->faces.length;
    info.face_count = model->positions.length / 3;
    info.pos = V3(0, 0, 0);
    info.aabb.min = V3(FLT_MAX, FLT_MAX, FLT_MAX);
    info.aabb.max = V3(FLT_MIN, FLT_MIN, FLT_MIN);

    golf_transform_t moved_transform = transform;
    if (movement) {
        moved_transform = golf_transform_apply_movement(moved_transform, *movement, t);
    }
    mat4 model_mat = golf_transform_get_model_mat(moved_transform);

    for (int i = 0; i < model->groups.length; i++) {
        golf_model_group_t group = model->groups.data[i];

        golf_material_t material;
        if (!golf_level_get_material(level, group.material_name, &material)) {
            material = golf_material_texture("", 0, 0, 0, "data/textures/fallback.png");
        }

        for (int j = 0; j < group.vertex_count; j += 3) {
            int v_idx = group.start_vertex + j;
            vec3 a = vec3_apply_mat4(model->positions.data[v_idx + 0], 1, model_mat);
            vec3 b = vec3_apply_mat4(model->positions.data[v_idx + 1], 1, model_mat);
            vec3 c = vec3_apply_mat4(model->positions.data[v_idx + 2], 1, model_mat);

            info.pos = vec3_add(info.pos, a);
            info.pos = vec3_add(info.pos, b);
            info.pos = vec3_add(info.pos, c);

            golf_bvh_face_t face;
            face.a = a;
            face.b = b;
            face.c = c;
            face.restitution = material.restitution;
            face.friction = material.friction;
            face.vel_scale = material.vel_scale;
            face.level = level;
            face.entity = entity;
            face.t = t;
            if (model->is_water) {
                face.water_dir = vec3_apply_mat4(model->water_dir.data[j / 3], 0, model_mat);
            }
            else {
                face.water_dir = V3(0, 0, 0);
            }
            vec_push(&bvh->faces, face);

            _update_aabb(&info.aabb, a);
            _update_aabb(&info.aabb, b);
            _update_aabb(&info.aabb, c);
        }
    }

    info.pos = vec3_scale(info.pos, 1.0f / model->positions.length);

    return info;
}